

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas1_s.cpp
# Opt level: O0

void sswap(int n,float *x,int incx,float *y,int incy)

{
  float fVar1;
  int iVar2;
  float temp;
  int m;
  int iy;
  int ix;
  int i;
  int incy_local;
  float *y_local;
  int incx_local;
  float *x_local;
  int n_local;
  
  if (0 < n) {
    if ((incx == 1) && (incy == 1)) {
      for (iy = 0; iVar2 = n % 3, iy < n % 3; iy = iy + 1) {
        fVar1 = x[iy];
        x[iy] = y[iy];
        y[iy] = fVar1;
      }
      while (iy = iVar2, iy < n) {
        fVar1 = x[iy];
        x[iy] = y[iy];
        y[iy] = fVar1;
        fVar1 = x[iy + 1];
        x[iy + 1] = y[iy + 1];
        y[iy + 1] = fVar1;
        fVar1 = x[iy + 2];
        x[iy + 2] = y[iy + 2];
        y[iy + 2] = fVar1;
        iVar2 = iy + 3;
      }
    }
    else {
      if (incx < 0) {
        m = (1 - n) * incx;
      }
      else {
        m = 0;
      }
      if (incy < 0) {
        temp = (float)((1 - n) * incy);
      }
      else {
        temp = 0.0;
      }
      for (iy = 0; iy < n; iy = iy + 1) {
        fVar1 = x[m];
        x[m] = y[(int)temp];
        y[(int)temp] = fVar1;
        m = m + incx;
        temp = (float)((int)temp + incy);
      }
    }
  }
  return;
}

Assistant:

void sswap ( int n, float x[], int incx, float y[], int incy )

//****************************************************************************80
//
//  Purpose:
//
//    SSWAP interchanges two float vectors.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    23 February 2006
//
//  Author:
//
//    C++ version by John Burkardt
//
//  Reference:
//
//    Jack Dongarra, Cleve Moler, Jim Bunch, Pete Stewart,
//    LINPACK User's Guide,
//    SIAM, 1979,
//    ISBN13: 978-0-898711-72-1,
//    LC: QA214.L56.
//
//    Charles Lawson, Richard Hanson, David Kincaid, Fred Krogh,
//    Basic Linear Algebra Subprograms for Fortran Usage,
//    Algorithm 539,
//    ACM Transactions on Mathematical Software,
//    Volume 5, Number 3, September 1979, pages 308-323.
//
//  Parameters:
//
//    Input, int N, the number of entries in the vectors.
//
//    Input/output, float X[*], one of the vectors to swap.
//
//    Input, int INCX, the increment between successive entries of X.
//
//    Input/output, float Y[*], one of the vectors to swap.
//
//    Input, int INCY, the increment between successive elements of Y.
//
{
  int i;
  int ix;
  int iy;
  int m;
  float temp;

  if ( n <= 0 )
  {
  }
  else if ( incx == 1 && incy == 1 )
  {
    m = n % 3;

    for ( i = 0; i < m; i++ )
    {
      temp = x[i];
      x[i] = y[i];
      y[i] = temp;
    }

    for ( i = m; i < n; i = i + 3 )
    {
      temp = x[i];
      x[i] = y[i];
      y[i] = temp;

      temp = x[i+1];
      x[i+1] = y[i+1];
      y[i+1] = temp;

      temp = x[i+2];
      x[i+2] = y[i+2];
      y[i+2] = temp;
    }
  }
  else
  {
    if ( 0 <= incx )
    {
      ix = 0;
    }
    else
    {
      ix = ( - n + 1 ) * incx;
    }

    if ( 0 <= incy )
    {
      iy = 0;
    }
    else
    {
      iy = ( - n + 1 ) * incy;
    }

    for ( i = 0; i < n; i++ )
    {
      temp = x[ix];
      x[ix] = y[iy];
      y[iy] = temp;
      ix = ix + incx;
      iy = iy + incy;
    }
  }
  return;
}